

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O2

void d68020_bfins(void)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  uint in_EDI;
  bool bVar4;
  char width [3];
  char offset [3];
  
  if (((byte)g_cpu_type & 0x1c) != 0) {
    uVar1 = dasm_read_imm_16(in_EDI);
    bVar4 = (uVar1 >> 0xb & 1) == 0;
    uVar2 = 7;
    if (bVar4) {
      uVar2 = 0x1f;
    }
    pcVar3 = "D%d";
    if (bVar4) {
      pcVar3 = "%d";
    }
    sprintf(offset,pcVar3,(ulong)(uVar2 & uVar1 >> 6));
    if ((uVar1 & 0x20) == 0) {
      uVar2 = g_5bit_data_table[uVar1 & 0x1f];
      pcVar3 = "%d";
    }
    else {
      uVar2 = uVar1 & 7;
      pcVar3 = "D%d";
    }
    sprintf(width,pcVar3,(ulong)uVar2);
    pcVar3 = get_ea_mode_str(g_cpu_ir,0);
    sprintf(g_dasm_str,"bfins   D%d, %s {%s:%s}; (2+)",(ulong)(uVar1 >> 0xc & 7),pcVar3,offset,width
           );
    return;
  }
  if ((~g_cpu_ir & 0xf000) != 0) {
    d68000_illegal();
    return;
  }
  sprintf(g_dasm_str,"dc.w    $%04x; opcode 1111",(ulong)g_cpu_ir);
  return;
}

Assistant:

static void d68020_bfins(void)
{
	uint extension;
	char offset[3];
	char width[3];

	LIMIT_CPU_TYPES(M68020_PLUS);

	extension = read_imm_16();

	if(BIT_B(extension))
		sprintf(offset, "D%d", (extension>>6)&7);
	else
		sprintf(offset, "%d", (extension>>6)&31);
	if(BIT_5(extension))
		sprintf(width, "D%d", extension&7);
	else
		sprintf(width, "%d", g_5bit_data_table[extension&31]);
	sprintf(g_dasm_str, "bfins   D%d, %s {%s:%s}; (2+)", (extension>>12)&7, get_ea_mode_str_8(g_cpu_ir), offset, width);
}